

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::Print
          (TPZMatrix<std::complex<long_double>_> *this,char *name,ostream *out,
          MatrixOutputFormat form)

{
  undefined1 val_00 [16];
  undefined1 val_01 [16];
  complex<long_double> a;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  int in_ECX;
  ostream *in_RDX;
  char *in_RSI;
  complex<long_double> *pcVar5;
  char *this_00;
  TPZBaseMatrix *pTVar6;
  TPZBaseMatrix *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar7;
  longdouble in_ST6;
  longdouble lVar8;
  longdouble in_ST7;
  longdouble lVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  complex<long_double> val_4;
  int64_t col_7;
  int64_t colmax_1;
  int64_t row_7;
  complex<long_double> val_3;
  int64_t col_6;
  int64_t colmax;
  int64_t row_6;
  int64_t nrow;
  int64_t numzero;
  bool sym;
  int64_t col_5;
  int64_t row_5;
  char signchar;
  complex<long_double> val_2;
  int64_t col_4;
  int64_t row_4;
  complex<long_double> val_1;
  int64_t col_3;
  int64_t row_3;
  complex<long_double> val;
  int64_t col_2;
  int64_t row_2;
  int64_t col_1;
  int64_t row_1;
  anon_class_4_1_2f8713ba PrintVal;
  int columnlength;
  complex<long_double> value;
  int64_t col;
  int64_t row;
  int64_t ncols;
  int64_t nrows;
  ios cout_state;
  undefined8 uVar10;
  undefined2 uVar11;
  undefined6 in_stack_fffffffffffffa52;
  undefined8 in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  ostream *in_stack_fffffffffffffa78;
  anon_class_4_1_2f8713ba *in_stack_fffffffffffffa80;
  undefined7 in_stack_fffffffffffffa88;
  undefined1 in_stack_fffffffffffffa8f;
  undefined8 in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  complex<long_double> local_398;
  complex local_378 [40];
  long local_350;
  long local_348;
  long local_340;
  complex<long_double> local_338;
  undefined1 local_318 [32];
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  byte local_2c9;
  undefined1 local_2c8 [40];
  long local_2a0;
  long local_298;
  char local_289;
  longdouble local_288 [2];
  long local_268;
  long local_260;
  longdouble local_258 [2];
  long local_238;
  long local_230;
  complex<long_double> local_228;
  complex local_208 [32];
  long local_1e8;
  long local_1e0;
  undefined8 local_1d8 [5];
  long local_1b0;
  long local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  complex<long_double> local_198;
  complex local_178 [32];
  long local_158;
  long local_150;
  int64_t local_148;
  long local_140;
  int local_138;
  ios local_128 [268];
  int local_1c;
  ostream *local_18;
  char *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::ios::ios(local_128,(streambuf *)0x0);
  std::ios::copyfmt(local_128);
  poVar3 = local_18;
  local_138 = (int)std::setprecision(0x15);
  std::operator<<(poVar3,(_Setprecision)local_138);
  local_140 = TPZBaseMatrix::Rows(in_RDI);
  local_148 = TPZBaseMatrix::Cols(in_RDI);
  if (local_1c == 0) {
    std::operator<<(local_18,"Writing matrix \'");
    if (local_10 != (char *)0x0) {
      std::operator<<(local_18,local_10);
    }
    poVar3 = std::operator<<(local_18,"\' (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_140);
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_148);
    std::operator<<(poVar3,"):\n");
    for (local_150 = 0; local_150 < local_140; local_150 = local_150 + 1) {
      std::operator<<(local_18,"\t");
      for (local_158 = 0; poVar3 = local_18, local_158 < local_148; local_158 = local_158 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_178,in_RDI,local_150,local_158);
        poVar3 = std::operator<<(poVar3,local_178);
        std::operator<<(poVar3,"  ");
      }
      std::operator<<(local_18,"\n");
    }
    std::operator<<(local_18,"\n");
  }
  else if (local_1c == 6) {
    std::operator<<(local_18,"Writing matrix \'");
    if (local_10 != (char *)0x0) {
      std::operator<<(local_18,local_10);
    }
    poVar3 = std::operator<<(local_18,"\' (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_140);
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_148);
    std::operator<<(poVar3,"):\n");
    lVar8 = (longdouble)0;
    uVar10 = SUB108(lVar8,0);
    uVar11 = (undefined2)((unkuint10)lVar8 >> 0x40);
    lVar7 = in_ST5;
    std::complex<long_double>::complex(&local_198,lVar8,lVar8);
    local_19c = 0x15;
    local_1a0 = 0x15;
    for (local_1a8 = 0; local_1a8 < local_140; local_1a8 = local_1a8 + 1) {
      for (local_1b0 = 0; local_1b0 < local_148; local_1b0 = local_1b0 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])
                  (local_1d8,in_RDI,local_1a8,local_1b0,in_R8,in_R9,uVar10,uVar11);
        local_198._M_value._16_8_ = local_1d8[2];
        local_198._M_value._24_8_ = local_1d8[3];
        local_198._M_value._0_8_ = local_1d8[0];
        local_198._M_value._8_8_ = local_1d8[1];
        pcVar5 = (complex<long_double> *)0x20c3905;
        std::operator<<(local_18,"(");
        std::complex<long_double>::real_abi_cxx11_((longdouble *)&local_198,pcVar5);
        val_00._8_8_ = in_stack_fffffffffffffa68;
        val_00._0_8_ = in_stack_fffffffffffffa60;
        lVar8 = lVar7;
        Print::anon_class_4_1_2f8713ba::operator()
                  (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,(type_conflict2)val_00);
        pcVar5 = (complex<long_double> *)0x203e1e9;
        std::operator<<(local_18,",");
        std::complex<long_double>::imag_abi_cxx11_((longdouble *)&local_198,pcVar5);
        uVar10 = SUB108(in_ST1,0);
        uVar11 = (undefined2)((unkuint10)in_ST1 >> 0x40);
        val_01._8_8_ = in_stack_fffffffffffffa68;
        val_01._0_8_ = in_stack_fffffffffffffa60;
        Print::anon_class_4_1_2f8713ba::operator()
                  (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,(type_conflict2)val_01);
        std::operator<<(local_18,")");
        in_ST1 = in_ST3;
        in_ST3 = in_ST5;
        in_ST5 = lVar7;
        lVar7 = lVar8;
      }
      std::operator<<(local_18,"\n");
    }
    std::operator<<(local_18,"\n");
  }
  else if (local_1c == 1) {
    poVar3 = (ostream *)std::ostream::operator<<(local_18,local_140);
    poVar3 = std::operator<<(poVar3," ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,local_148);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    for (local_1e0 = 0; local_1e0 < local_140; local_1e0 = local_1e0 + 1) {
      for (local_1e8 = 0; local_1e8 < local_148; local_1e8 = local_1e8 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_208,in_RDI,local_1e0,local_1e8);
        lVar8 = (longdouble)0;
        pcVar5 = SUB108(lVar8,0);
        uVar11 = (undefined2)((unkuint10)lVar8 >> 0x40);
        std::complex<long_double>::complex(&local_228,lVar8,lVar8);
        bVar1 = std::operator!=((complex<long_double> *)CONCAT62(in_stack_fffffffffffffa52,uVar11),
                                pcVar5);
        if (bVar1) {
          poVar3 = (ostream *)std::ostream::operator<<(local_18,local_1e0);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1e8);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = std::operator<<(poVar3,local_208);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    std::operator<<(local_18,"-1 -1 0.\n");
  }
  else if (local_1c == 2) {
    poVar3 = std::operator<<(local_18,local_10);
    std::operator<<(poVar3,"\n{ ");
    for (local_230 = 0; local_230 < local_140; local_230 = local_230 + 1) {
      std::operator<<(local_18,"\n{ ");
      for (local_238 = 0; local_238 < local_148; local_238 = local_238 + 1) {
        pTVar6 = in_RDI;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_258,in_RDI,local_230,local_238);
        poVar3 = local_18;
        std::complex<long_double>::real_abi_cxx11_(local_258,(complex<long_double> *)pTVar6);
        lVar8 = in_ST7;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ST0);
        this_00 = "+I";
        poVar3 = std::operator<<(poVar3,"+I");
        in_ST0 = in_ST2;
        in_ST2 = in_ST4;
        in_ST4 = in_ST6;
        in_ST6 = lVar8;
        std::complex<long_double>::imag_abi_cxx11_(local_258,(complex<long_double> *)this_00);
        lVar9 = in_ST6;
        std::ostream::operator<<(poVar3,in_ST1);
        in_ST1 = in_ST3;
        lVar8 = in_ST5;
        lVar7 = in_ST7;
        if (local_238 < local_148 + -1) {
          std::operator<<(local_18,", ");
          in_ST1 = in_ST3;
          lVar8 = in_ST5;
          lVar7 = in_ST7;
        }
        in_ST7 = lVar9;
        in_ST5 = lVar7;
        in_ST3 = lVar8;
        if ((local_238 + 1) % 6 == 0) {
          std::operator<<(local_18,'\n');
        }
      }
      std::operator<<(local_18," }");
      if (local_230 < local_140 + -1) {
        std::operator<<(local_18,",");
      }
    }
    poVar3 = std::operator<<(local_18," };");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else if (local_1c == 5) {
    for (local_260 = 0; local_260 < local_140; local_260 = local_260 + 1) {
      for (local_268 = 0; local_268 < local_148; local_268 = local_268 + 1) {
        pTVar6 = in_RDI;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_288,in_RDI,local_260,local_268);
        std::complex<long_double>::imag_abi_cxx11_(local_288,(complex<long_double> *)pTVar6);
        poVar3 = local_18;
        local_289 = (in_ST0 <= (longdouble)0) * '\x02' + '+';
        in_ST0 = in_ST4;
        in_ST4 = in_ST6;
        std::complex<long_double>::real_abi_cxx11_(local_288,(complex<long_double> *)pTVar6);
        lVar8 = in_ST4;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ST1);
        pcVar5 = (complex<long_double> *)(ulong)(uint)(int)local_289;
        poVar3 = std::operator<<(poVar3,local_289);
        in_ST1 = in_ST5;
        in_ST5 = lVar8;
        std::complex<long_double>::imag_abi_cxx11_(local_288,pcVar5);
        lVar8 = in_ST5;
        std::fabs((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ST3);
        std::operator<<(poVar3,"j");
        if (local_268 < local_148 + -1) {
          std::operator<<(local_18," , ");
        }
        in_ST3 = in_ST6;
        in_ST6 = lVar8;
      }
      if (local_260 < local_140 + -1) {
        std::operator<<(local_18,"\n");
      }
    }
  }
  else if (local_1c == 3) {
    std::operator<<(local_18,local_10);
    for (local_298 = 0; local_298 < local_140; local_298 = local_298 + 1) {
      std::operator<<(local_18,"\n|");
      for (local_2a0 = 0; local_2a0 < local_148; local_2a0 = local_2a0 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_2c8,in_RDI,local_298,local_2a0);
        a._M_value._8_7_ = in_stack_fffffffffffffa88;
        a._M_value._0_8_ = in_stack_fffffffffffffa80;
        a._M_value[0xf] = in_stack_fffffffffffffa8f;
        a._M_value._16_8_ = in_stack_fffffffffffffa90;
        a._M_value._24_8_ = in_stack_fffffffffffffa98;
        bVar1 = IsZero(a);
        if (bVar1) {
          std::operator<<(local_18,".");
        }
        else {
          std::operator<<(local_18,"#");
        }
      }
      std::operator<<(local_18,"|");
    }
    std::operator<<(local_18,"\n");
  }
  else if (local_1c == 4) {
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x10])();
    local_2c9 = iVar2 != 0;
    local_2d8 = 0;
    local_2e0 = local_140;
    for (local_2e8 = 0; local_2e8 < local_140; local_2e8 = local_2e8 + 1) {
      local_2f0 = local_2e0;
      if ((local_2c9 & 1) != 0) {
        local_2f0 = local_2e8 + 1;
      }
      for (local_2f8 = 0; local_2f8 < local_2f0; local_2f8 = local_2f8 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_318,in_RDI,local_2e8,local_2f8);
        lVar8 = (longdouble)0;
        pcVar5 = SUB108(lVar8,0);
        uVar11 = (undefined2)((unkuint10)lVar8 >> 0x40);
        std::complex<long_double>::complex(&local_338,lVar8,lVar8);
        bVar1 = std::operator!=((complex<long_double> *)CONCAT62(in_stack_fffffffffffffa52,uVar11),
                                pcVar5);
        if (bVar1) {
          local_2d8 = local_2d8 + 1;
        }
      }
    }
    poVar3 = std::operator<<(local_18,"%%");
    poVar3 = std::operator<<(poVar3,local_10);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)std::ostream::operator<<(local_18,local_140);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_148);
    poVar3 = std::operator<<(poVar3,' ');
    pvVar4 = (void *)std::ostream::operator<<(poVar3,local_2d8);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    for (local_340 = 0; local_340 < local_140; local_340 = local_340 + 1) {
      local_348 = local_2e0;
      if ((local_2c9 & 1) != 0) {
        local_348 = local_340 + 1;
      }
      for (local_350 = 0; local_350 < local_348; local_350 = local_350 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_378,in_RDI,local_340,local_350);
        lVar8 = (longdouble)0;
        pcVar5 = SUB108(lVar8,0);
        uVar11 = (undefined2)((unkuint10)lVar8 >> 0x40);
        std::complex<long_double>::complex(&local_398,lVar8,lVar8);
        bVar1 = std::operator!=((complex<long_double> *)CONCAT62(in_stack_fffffffffffffa52,uVar11),
                                pcVar5);
        if (bVar1) {
          poVar3 = (ostream *)std::ostream::operator<<(local_18,local_340 + 1);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_350 + 1);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = std::operator<<(poVar3,local_378);
          std::operator<<(poVar3,'\n');
        }
      }
    }
  }
  std::ios::copyfmt((ios *)(local_18 + *(long *)(*(long *)local_18 + -0x18)));
  std::ios::~ios(local_128);
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}